

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

Gia_Man_t * Gia_ManEquivRemapDfs(Gia_Man_t *p)

{
  bool bVar1;
  int iVar2;
  uint Entry;
  int Num;
  int Id;
  Gia_Man_t *p_00;
  Gia_Rpr_t *pGVar3;
  long lVar4;
  Gia_Obj_t *pGVar5;
  Vec_Int_t *p_01;
  int *piVar6;
  uint Id_00;
  ulong uVar7;
  uint v;
  int iVar8;
  int i;
  
  p_00 = Gia_ManDupDfs(p);
  iVar2 = p_00->nObjs;
  pGVar3 = (Gia_Rpr_t *)calloc((long)iVar2,4);
  p_00->pReprs = pGVar3;
  for (lVar4 = 0; lVar4 < iVar2; lVar4 = lVar4 + 1) {
    p_00->pReprs[lVar4] = (Gia_Rpr_t)((uint)p_00->pReprs[lVar4] | 0xfffffff);
    iVar2 = p_00->nObjs;
  }
  for (lVar4 = 1; lVar4 < p->nObjs; lVar4 = lVar4 + 1) {
    if (((uint)p->pReprs[lVar4] & 0xfffffff) == 0) {
      pGVar5 = Gia_ManObj(p,(int)lVar4);
      iVar2 = Abc_Lit2Var(pGVar5->Value);
      Gia_ObjSetRepr(p_00,iVar2,0);
    }
  }
  p_01 = Vec_IntAlloc(100);
  uVar7 = 1;
  do {
    Id_00 = (uint)uVar7;
    if (p->nObjs <= (int)Id_00) {
      Vec_IntFree(p_01);
      piVar6 = Gia_ManDeriveNexts(p_00);
      p_00->pNexts = piVar6;
      return p_00;
    }
    iVar2 = Gia_ObjIsHead(p,Id_00);
    if (iVar2 != 0) {
      p_01->nSize = 0;
      for (v = Id_00; 0 < (int)v; v = p->pNexts[v]) {
        pGVar5 = Gia_ManObj(p,v);
        Entry = Abc_Lit2Var(pGVar5->Value);
        uVar7 = (ulong)Entry;
        Vec_IntPushUnique(p_01,Entry);
      }
      iVar2 = p_01->nSize;
      if (iVar2 < 2) {
        __assert_fail("Vec_IntSize( vClass ) > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                      ,0x3b9,"Gia_Man_t *Gia_ManEquivRemapDfs(Gia_Man_t *)");
      }
      Vec_IntSort(p_01,(int)uVar7);
      Num = Vec_IntEntry(p_01,0);
      i = 1;
      iVar8 = Num;
      while (iVar2 != i) {
        Id = Vec_IntEntry(p_01,i);
        Gia_ObjSetRepr(p_00,Id,Num);
        i = i + 1;
        bVar1 = Id <= iVar8;
        iVar8 = Id;
        if (bVar1) {
          __assert_fail("iPrev < iNode",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                        ,0x3bf,"Gia_Man_t *Gia_ManEquivRemapDfs(Gia_Man_t *)");
        }
      }
    }
    uVar7 = (ulong)(Id_00 + 1);
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManEquivRemapDfs( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Vec_Int_t * vClass;
    int i, k, iNode, iRepr, iPrev;
    pNew = Gia_ManDupDfs( p );
    // start representatives
    pNew->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(pNew) );
    for ( i = 0; i < Gia_ManObjNum(pNew); i++ )
        Gia_ObjSetRepr( pNew, i, GIA_VOID );
    // iterate over constant candidates
    Gia_ManForEachConst( p, i )
        Gia_ObjSetRepr( pNew, Abc_Lit2Var(Gia_ManObj(p, i)->Value), 0 );
    // iterate over class candidates
    vClass = Vec_IntAlloc( 100 );
    Gia_ManForEachClass( p, i )
    {
        Vec_IntClear( vClass );
        Gia_ClassForEachObj( p, i, k )
            Vec_IntPushUnique( vClass, Abc_Lit2Var(Gia_ManObj(p, k)->Value) );
        assert( Vec_IntSize( vClass ) > 1 );
        Vec_IntSort( vClass, 0 );
        iRepr = iPrev = Vec_IntEntry( vClass, 0 );
        Vec_IntForEachEntryStart( vClass, iNode, k, 1 )
        {
            Gia_ObjSetRepr( pNew, iNode, iRepr );
            assert( iPrev < iNode );
            iPrev = iNode;
        }
    }
    Vec_IntFree( vClass );
    pNew->pNexts = Gia_ManDeriveNexts( pNew );
    return pNew;
}